

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integercompressor.cpp
# Opt level: O0

void __thiscall IntegerCompressor::initCompressor(IntegerCompressor *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ArithmeticModel **ppAVar3;
  ArithmeticModel *pAVar4;
  uint local_14;
  U32 i;
  IntegerCompressor *this_local;
  
  if (this->enc == (ArithmeticEncoder *)0x0) {
    __assert_fail("enc",
                  "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/integercompressor.cpp"
                  ,0xdf,"void IntegerCompressor::initCompressor()");
  }
  if (this->mBits == (ArithmeticModel **)0x0) {
    auVar1 = ZEXT416(this->contexts) * ZEXT816(8);
    uVar2 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    ppAVar3 = (ArithmeticModel **)operator_new__(uVar2);
    this->mBits = ppAVar3;
    for (local_14 = 0; local_14 < this->contexts; local_14 = local_14 + 1) {
      pAVar4 = ArithmeticEncoder::createSymbolModel(this->enc,this->corr_bits + 1);
      this->mBits[local_14] = pAVar4;
    }
    auVar1 = ZEXT416(this->corr_bits + 1) * ZEXT816(8);
    uVar2 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    ppAVar3 = (ArithmeticModel **)operator_new__(uVar2);
    this->mCorrector = ppAVar3;
    pAVar4 = (ArithmeticModel *)ArithmeticEncoder::createBitModel(this->enc);
    *this->mCorrector = pAVar4;
    for (local_14 = 1; local_14 <= this->corr_bits; local_14 = local_14 + 1) {
      if (this->bits_high < local_14) {
        pAVar4 = ArithmeticEncoder::createSymbolModel(this->enc,1 << ((byte)this->bits_high & 0x1f))
        ;
        this->mCorrector[local_14] = pAVar4;
      }
      else {
        pAVar4 = ArithmeticEncoder::createSymbolModel(this->enc,1 << ((byte)local_14 & 0x1f));
        this->mCorrector[local_14] = pAVar4;
      }
    }
  }
  for (local_14 = 0; local_14 < this->contexts; local_14 = local_14 + 1) {
    ArithmeticEncoder::initSymbolModel(this->enc,this->mBits[local_14],(U32 *)0x0);
  }
  ArithmeticEncoder::initBitModel(this->enc,(ArithmeticBitModel *)*this->mCorrector);
  for (local_14 = 1; local_14 <= this->corr_bits; local_14 = local_14 + 1) {
    ArithmeticEncoder::initSymbolModel(this->enc,this->mCorrector[local_14],(U32 *)0x0);
  }
  return;
}

Assistant:

void IntegerCompressor::initCompressor()
{
  U32 i;

  assert(enc);

  // maybe create the models
  if (mBits == 0)
  {
    mBits = new ArithmeticModel*[contexts];
    for (i = 0; i < contexts; i++)
    {
      mBits[i] = enc->createSymbolModel(corr_bits+1);
    }
#ifndef COMPRESS_ONLY_K
    mCorrector = new ArithmeticModel*[corr_bits+1];
    mCorrector[0] = (ArithmeticModel*)enc->createBitModel();
    for (i = 1; i <= corr_bits; i++)
    {
      if (i <= bits_high)
      {
        mCorrector[i] = enc->createSymbolModel(1<<i);
      }
      else
      {
        mCorrector[i] = enc->createSymbolModel(1<<bits_high);
      }
    }
#endif
  }

  // certainly init the models
  for (i = 0; i < contexts; i++)
  {
    enc->initSymbolModel(mBits[i]);
  }
#ifndef COMPRESS_ONLY_K
  enc->initBitModel((ArithmeticBitModel*)mCorrector[0]);
  for (i = 1; i <= corr_bits; i++)
  {
    enc->initSymbolModel(mCorrector[i]);
  }
#endif
}